

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O3

map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
* picobench::report::get_problem_space_view
            (map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
             *__return_storage_ptr__,suite *s)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  pointer pbVar3;
  pointer pbVar4;
  iterator __position;
  mapped_type *this;
  benchmark *bm;
  pointer pbVar5;
  benchmark_problem_space *d;
  pointer __k;
  problem_space_benchmark local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar5 = (s->benchmarks).
           super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (s->benchmarks).
           super__Vector_base<picobench::report::benchmark,_std::allocator<picobench::report::benchmark>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar3) {
    do {
      pbVar4 = (pbVar5->data).
               super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (pbVar5->data).
                 super__Vector_base<picobench::report::benchmark_problem_space,_std::allocator<picobench::report::benchmark_problem_space>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pbVar4; __k = __k + 1) {
        this = std::
               map<int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>_>_>_>
               ::operator[](__return_storage_ptr__,&__k->dimension);
        local_50.name = pbVar5->name;
        local_50.is_baseline = pbVar5->is_baseline;
        local_50.total_time_ns = __k->total_time_ns;
        local_50.result = __k->result;
        __position._M_current =
             (this->
             super__Vector_base<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->
            super__Vector_base<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
          ::_M_realloc_insert<picobench::report::problem_space_benchmark>(this,__position,&local_50)
          ;
        }
        else {
          (__position._M_current)->total_time_ns = local_50.total_time_ns;
          (__position._M_current)->result = local_50.result;
          (__position._M_current)->name = local_50.name;
          *(ulong *)&(__position._M_current)->is_baseline =
               CONCAT71(local_50._9_7_,local_50.is_baseline);
          pppVar2 = &(this->
                     super__Vector_base<picobench::report::problem_space_benchmark,_std::allocator<picobench::report::problem_space_benchmark>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + 1;
        }
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::map<int, std::vector<problem_space_benchmark>> get_problem_space_view(const suite& s)
    {
        std::map<int, std::vector<problem_space_benchmark>> res;
        for (auto& bm : s.benchmarks)
        {
            for (auto& d : bm.data)
            {
                auto& pvbs = res[d.dimension];
                pvbs.push_back({ bm.name, bm.is_baseline, d.total_time_ns, d.result });
            }
        }
        return res;
    }